

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

void duckdb::PragmaTableInfo::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_402;
  allocator local_401;
  LogicalType local_400;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d0;
  string local_3b8;
  string local_398;
  TableFunction local_378;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_398,"pragma_table_info",&local_401);
  LogicalType::LogicalType(&local_400,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_400;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d0,__l,&local_402);
  TableFunction::TableFunction
            (&local_1c0,&local_398,(vector<duckdb::LogicalType,_true> *)&local_3d0,
             PragmaTableInfoFunction,PragmaTableInfoBind<true>,PragmaTableInfoInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1c0);
  TableFunction::~TableFunction(&local_1c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d0);
  LogicalType::~LogicalType(&local_400);
  ::std::__cxx11::string::~string((string *)&local_398);
  ::std::__cxx11::string::string((string *)&local_3b8,"pragma_show",&local_401);
  LogicalType::LogicalType(&local_400,VARCHAR);
  __l_00._M_len = 1;
  __l_00._M_array = &local_400;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3e8,__l_00,&local_402);
  TableFunction::TableFunction
            (&local_378,&local_3b8,(vector<duckdb::LogicalType,_true> *)&local_3e8,
             PragmaTableInfoFunction,PragmaTableInfoBind<false>,PragmaTableInfoInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_378);
  TableFunction::~TableFunction(&local_378);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e8);
  LogicalType::~LogicalType(&local_400);
  ::std::__cxx11::string::~string((string *)&local_3b8);
  return;
}

Assistant:

void PragmaTableInfo::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("pragma_table_info", {LogicalType::VARCHAR}, PragmaTableInfoFunction,
	                              PragmaTableInfoBind<true>, PragmaTableInfoInit));
	set.AddFunction(TableFunction("pragma_show", {LogicalType::VARCHAR}, PragmaTableInfoFunction,
	                              PragmaTableInfoBind<false>, PragmaTableInfoInit));
}